

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conncache.c
# Opt level: O2

CURLcode Curl_cpool_add_conn(Curl_easy *data,connectdata *conn)

{
  undefined1 *puVar1;
  char *__src;
  size_t __n;
  size_t sVar2;
  long lVar3;
  cpool *cpool;
  cpool_bundle *l;
  void *pvVar4;
  CURLcode CVar5;
  
  cpool = cpool_get_instance(data);
  if (cpool == (cpool *)0x0) {
    return CURLE_FAILED_INIT;
  }
  if ((cpool->share != (Curl_share *)0x0) && ((cpool->share->specifier & 0x20) != 0)) {
    Curl_share_lock(cpool->idata,CURL_LOCK_DATA_CONNECT,CURL_LOCK_ACCESS_SINGLE);
  }
  cpool->field_0x98 = cpool->field_0x98 | 1;
  l = cpool_find_bundle(cpool,conn);
  if (l == (cpool_bundle *)0x0) {
    __src = conn->destination;
    __n = conn->destination_len;
    l = (cpool_bundle *)(*Curl_ccalloc)(1,__n + 0x30);
    CVar5 = CURLE_OUT_OF_MEMORY;
    if (l == (cpool_bundle *)0x0) goto LAB_00118d2d;
    Curl_llist_init((Curl_llist *)l,(Curl_llist_dtor)0x0);
    l->dest_len = __n;
    memcpy(l->dest,__src,__n);
    pvVar4 = Curl_hash_add(&cpool->dest2bundle,l->dest,__n,l);
    if (pvVar4 == (void *)0x0) {
      (*Curl_cfree)(l);
      goto LAB_00118d2d;
    }
  }
  Curl_llist_append(&l->conns,conn,&conn->cpool_node);
  puVar1 = &(conn->bits).field_0x4;
  *puVar1 = *puVar1 | 2;
  sVar2 = cpool->num_conn;
  lVar3 = cpool->next_connection_id;
  conn->connection_id = lVar3;
  cpool->num_conn = sVar2 + 1;
  cpool->next_connection_id = lVar3 + 1;
  CVar5 = CURLE_OK;
LAB_00118d2d:
  cpool->field_0x98 = cpool->field_0x98 & 0xfe;
  if ((cpool->share != (Curl_share *)0x0) && ((cpool->share->specifier & 0x20) != 0)) {
    Curl_share_unlock(cpool->idata,CURL_LOCK_DATA_CONNECT);
  }
  return CVar5;
}

Assistant:

CURLcode Curl_cpool_add_conn(struct Curl_easy *data,
                             struct connectdata *conn)
{
  CURLcode result = CURLE_OK;
  struct cpool_bundle *bundle = NULL;
  struct cpool *cpool = cpool_get_instance(data);
  DEBUGASSERT(conn);

  DEBUGASSERT(cpool);
  if(!cpool)
    return CURLE_FAILED_INIT;

  CPOOL_LOCK(cpool);
  bundle = cpool_find_bundle(cpool, conn);
  if(!bundle) {
    bundle = cpool_add_bundle(cpool, conn);
    if(!bundle) {
      result = CURLE_OUT_OF_MEMORY;
      goto out;
    }
  }

  cpool_bundle_add(bundle, conn);
  conn->connection_id = cpool->next_connection_id++;
  cpool->num_conn++;
  DEBUGF(infof(data, "Added connection %" FMT_OFF_T ". "
               "The cache now contains %zu members",
               conn->connection_id, cpool->num_conn));
out:
  CPOOL_UNLOCK(cpool);

  return result;
}